

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O1

QMargins __thiscall QLineEditPrivate::effectiveTextMargins(QLineEditPrivate *this)

{
  int iVar1;
  LayoutDirection LVar2;
  int iVar3;
  SideWidgetEntryList *pSVar4;
  long in_FS_OFFSET;
  QMargins QVar5;
  SideWidgetParameters local_58;
  SideWidgetParameters local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (this->textMargins).m_left.m_i;
  LVar2 = QWidget::layoutDirection(*(QWidget **)&(this->super_QWidgetPrivate).field_0x8);
  pSVar4 = &this->trailingSideWidgets;
  if (LVar2 == LeftToRight) {
    pSVar4 = &this->leadingSideWidgets;
  }
  local_48 = sideWidgetParameters(this);
  QVar5.m_left.m_i = effectiveTextMargin(iVar3,pSVar4,&local_48);
  iVar3 = (this->textMargins).m_right.m_i;
  iVar1 = (this->textMargins).m_top.m_i;
  LVar2 = QWidget::layoutDirection(*(QWidget **)&(this->super_QWidgetPrivate).field_0x8);
  pSVar4 = &this->leadingSideWidgets;
  if (LVar2 == LeftToRight) {
    pSVar4 = &this->trailingSideWidgets;
  }
  local_58 = sideWidgetParameters(this);
  iVar3 = effectiveTextMargin(iVar3,pSVar4,&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar5.m_top.m_i = iVar1;
    QVar5.m_bottom.m_i = (this->textMargins).m_bottom.m_i;
    QVar5.m_right.m_i = iVar3;
    return QVar5;
  }
  __stack_chk_fail();
}

Assistant:

QMargins QLineEditPrivate::effectiveTextMargins() const
{
    return {effectiveTextMargin(textMargins.left(), leftSideWidgetList(), sideWidgetParameters()),
            textMargins.top(),
            effectiveTextMargin(textMargins.right(), rightSideWidgetList(), sideWidgetParameters()),
            textMargins.bottom()};
}